

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseValueTypeList
          (WastParser *this,TypeVector *out_type_list,
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *type_names)

{
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  string *__args_1;
  int __c;
  Var *out_type;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar3;
  Type local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  undefined1 local_90;
  size_type local_88;
  Type local_80;
  int local_78;
  Enum local_74;
  undefined1 local_70 [8];
  Var type;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *type_names_local;
  TypeVector *out_type_list_local;
  WastParser *this_local;
  
  type.field_2._24_8_ = type_names;
  do {
    bVar1 = PeekMatchRefType(this);
    if ((!bVar1) && (bVar1 = PeekMatch(this,First_Type,0), !bVar1)) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Var::Var((Var *)local_70);
    out_type = (Var *)local_70;
    local_74 = (Enum)ParseValueType(this,out_type);
    bVar1 = Failed((Result)local_74);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_78 = 1;
    }
    else {
      bVar1 = Var::is_index((Var *)local_70);
      if (bVar1) {
        pcVar2 = Var::index((Var *)local_70,(char *)out_type,__c);
        Type::Type(&local_80,(int32_t)pcVar2);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_type_list,&local_80);
      }
      else {
        bVar1 = Var::is_name((Var *)local_70);
        if (!bVar1) {
          __assert_fail("type.is_name()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x3be,
                        "Result wabt::WastParser::ParseValueTypeList(TypeVector *, std::unordered_map<uint32_t, std::string> *)"
                       );
        }
        bVar1 = Features::function_references_enabled(&this->options_->features);
        this_00 = type.field_2._24_8_;
        if (!bVar1) {
          __assert_fail("options_->features.function_references_enabled()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x3bf,
                        "Result wabt::WastParser::ParseValueTypeList(TypeVector *, std::unordered_map<uint32_t, std::string> *)"
                       );
        }
        local_88 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(out_type_list);
        __args_1 = Var::name_abi_cxx11_((Var *)local_70);
        pVar3 = std::
                unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                ::emplace<unsigned_long,std::__cxx11::string_const&>
                          ((unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                            *)this_00,&local_88,__args_1);
        local_98._M_cur =
             (__node_type *)
             pVar3.first.
             super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             ._M_cur;
        local_90 = pVar3.second;
        Type::Type(&local_a0,Reference,0xffffffff);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_type_list,&local_a0);
      }
      local_78 = 0;
    }
    Var::~Var((Var *)local_70);
    if (local_78 != 0) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseValueTypeList(
    TypeVector* out_type_list,
    std::unordered_map<uint32_t, std::string>* type_names) {
  WABT_TRACE(ParseValueTypeList);
  while (true) {
    if (!PeekMatchRefType() && !PeekMatch(TokenType::ValueType)) {
      break;
    }

    Var type;
    CHECK_RESULT(ParseValueType(&type));

    if (type.is_index()) {
      out_type_list->push_back(Type(type.index()));
    } else {
      assert(type.is_name());
      assert(options_->features.function_references_enabled());
      type_names->emplace(out_type_list->size(), type.name());
      out_type_list->push_back(Type(Type::Reference, kInvalidIndex));
    }
  }

  return Result::Ok;
}